

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::HighbdDrPredTest::HighbdDrPredTest(HighbdDrPredTest *this)

{
  undefined8 *in_RDI;
  DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  *unaff_retaddr;
  
  DrPredTest<unsigned_short,_void_(*)(unsigned_short_*,_long,_int,_int,_const_unsigned_short_*,_const_unsigned_short_*,_int,_int,_int,_int,_int)>
  ::DrPredTest(unaff_retaddr);
  *in_RDI = &PTR__HighbdDrPredTest_01f4c340;
  in_RDI[2] = &PTR__HighbdDrPredTest_01f4c380;
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, SaturatedValues) {
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; ++angle) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, true, angle);
    }
  }
}